

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O2

void __thiscall XMISong::FoundXMID(XMISong *this,BYTE *chunk,int len,TrackInfo *song)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  do {
    if (len + -8 < iVar3) {
      return;
    }
    iVar1 = *(int *)(chunk + iVar3);
    uVar2 = GetBigInt((uchar *)((long)(chunk + iVar3) + 4));
    if (iVar1 == 0x424d4954) {
      song->TimbreChunk = chunk + (long)iVar3 + 8;
      song->TimbreLen = (long)(int)uVar2;
    }
    else if (iVar1 == 0x544e5645) {
      song->EventChunk = chunk + (long)iVar3 + 8;
      song->EventLen = (long)(int)uVar2;
      return;
    }
    iVar3 = iVar3 + uVar2 + (uVar2 & 1) + 8;
  } while( true );
}

Assistant:

void XMISong::FoundXMID(const BYTE *chunk, int len, TrackInfo *song) const
{
	for (int p = 0; p <= len - 8; )
	{
		int chunktype = GetNativeInt(chunk + p);
		int chunklen = GetBigInt(chunk + p + 4);

		if (chunktype == MAKE_ID('T','I','M','B'))
		{
			song->TimbreChunk = chunk + p + 8;
			song->TimbreLen = chunklen;
		}
		else if (chunktype == MAKE_ID('E','V','N','T'))
		{
			song->EventChunk = chunk + p + 8;
			song->EventLen = chunklen;
			// EVNT must be the final chunk in the FORM.
			break;
		}
		p += 8 + chunklen + (chunklen & 1);
	}
}